

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O3

bool __thiscall TxReconciliationTracker::Impl::IsPeerRegistered(Impl *this,NodeId peer_id)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock15;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_owns = false;
  local_28._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_28);
  uVar1 = (this->m_states)._M_h._M_bucket_count;
  bVar6 = false;
  uVar5 = (ulong)peer_id % uVar1;
  p_Var2 = (this->m_states)._M_h._M_buckets[uVar5];
  if (p_Var2 != (__node_base_ptr)0x0) {
    p_Var3 = p_Var2->_M_nxt;
    p_Var4 = p_Var3[1]._M_nxt;
    do {
      if (p_Var4 == (_Hash_node_base *)peer_id) {
        bVar6 = *(char *)&p_Var3[5]._M_nxt == '\x01';
        break;
      }
      p_Var3 = p_Var3->_M_nxt;
      if (p_Var3 == (_Hash_node_base *)0x0) {
        bVar6 = false;
        break;
      }
      p_Var4 = p_Var3[1]._M_nxt;
      bVar6 = false;
    } while ((ulong)p_Var4 % uVar1 == uVar5);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);
        auto recon_state = m_states.find(peer_id);
        return (recon_state != m_states.end() &&
                std::holds_alternative<TxReconciliationState>(recon_state->second));
    }